

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::fixColumn(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *lp,int j,bool correctIdx)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  pointer pnVar5;
  Real eps;
  bool bVar6;
  type_conflict5 tVar7;
  fpclass_type fVar8;
  double *pdVar9;
  FixVariablePS *this_00;
  long lVar10;
  long lVar11;
  Item *pIVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint *puVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  pointer pnVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  uint *puVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  soplex *psVar23;
  undefined1 uVar24;
  int32_t iVar25;
  int iVar26;
  byte bVar27;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_9c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<200U,_int,_void> local_8b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  soplex local_6b0 [112];
  int local_640;
  undefined1 local_63c;
  undefined8 local_638;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  soplex local_530 [112];
  int local_4c0;
  undefined1 local_4bc;
  undefined8 local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lo;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  up;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar27 = 0;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = 0x1c;
  puVar16 = (uint *)(pnVar5 + j);
  puVar20 = (uint *)&lo;
  for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar20 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar20 = puVar20 + 1;
  }
  iVar26 = pnVar5[j].m_backend.exp;
  lo.m_backend.exp = iVar26;
  uVar24 = pnVar5[j].m_backend.neg;
  lo.m_backend.neg = (bool)uVar24;
  fVar8 = pnVar5[j].m_backend.fpclass;
  lo.m_backend.fpclass = fVar8;
  iVar25 = pnVar5[j].m_backend.prec_elem;
  lo.m_backend.prec_elem = iVar25;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar16 = (uint *)(pnVar5 + j);
  puVar20 = (uint *)&up;
  for (; lVar11 != 0; lVar11 = lVar11 + -1) {
    *puVar20 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar20 = puVar20 + 1;
  }
  iVar2 = pnVar5[j].m_backend.exp;
  up.m_backend.exp = iVar2;
  bVar6 = pnVar5[j].m_backend.neg;
  up.m_backend.neg = bVar6;
  fVar3 = pnVar5[j].m_backend.fpclass;
  up.m_backend.fpclass = fVar3;
  iVar4 = pnVar5[j].m_backend.prec_elem;
  up.m_backend.prec_elem = iVar4;
  pIVar12 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[j].idx;
  lVar11 = 0x1c;
  puVar16 = (uint *)&lo;
  pcVar19 = &local_8b8;
  for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pcVar19->data)._M_elems[0] = *puVar16;
    puVar16 = puVar16 + 1;
    pcVar19 = (cpp_dec_float<200U,_int,_void> *)((pcVar19->data)._M_elems + 1);
  }
  local_8b8.exp = iVar26;
  local_8b8.neg = (bool)uVar24;
  local_8b8.prec_elem = iVar25;
  local_8b8.fpclass = fVar8;
  puVar16 = (uint *)&lo;
  puVar20 = (uint *)&local_3b0;
  for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar20 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar20 = puVar20 + 1;
  }
  local_3b0.m_backend.exp = iVar26;
  local_3b0.m_backend.neg = (bool)uVar24;
  local_3b0.m_backend.fpclass = fVar8;
  local_3b0.m_backend.prec_elem = iVar25;
  puVar16 = (uint *)&up;
  puVar20 = (uint *)&local_430;
  for (; lVar11 != 0; lVar11 = lVar11 + -1) {
    *puVar20 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar20 = puVar20 + 1;
  }
  psVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  local_430.m_backend.exp = iVar2;
  local_430.m_backend.neg = bVar6;
  local_430.m_backend.fpclass = fVar3;
  local_430.m_backend.prec_elem = iVar4;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&ptr,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  eps = Tolerances::epsilon((Tolerances *)
                            ptr.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
  bVar6 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_3b0,&local_430,eps);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (bVar6) {
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,&up.m_backend,&lo.m_backend);
    rhs.m_backend.data._M_elems[0] = 0;
    rhs.m_backend.data._M_elems[1] = 0x40000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              ((cpp_dec_float<200U,_int,_void> *)&ptr,&result.m_backend,(double *)&rhs);
    pcVar19 = (cpp_dec_float<200U,_int,_void> *)&ptr;
    pcVar21 = &local_8b8;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pcVar21->data)._M_elems[0] = (pcVar19->data)._M_elems[0];
      pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar27 * -2 + 1) * 4);
    }
    local_8b8.exp = 0;
    local_8b8.neg = false;
    local_8b8.fpclass = cpp_dec_float_finite;
    local_8b8.prec_elem = 0x1c;
    iVar26 = lo.m_backend.exp;
    uVar24 = lo.m_backend.neg;
    iVar25 = lo.m_backend.prec_elem;
    fVar8 = lo.m_backend.fpclass;
  }
  pnVar17 = &lo;
  pnVar22 = &local_b0;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar27 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = iVar26;
  local_b0.m_backend.neg = (bool)uVar24;
  local_b0.m_backend.fpclass = fVar8;
  local_b0.m_backend.prec_elem = iVar25;
  epsZero(&local_130,this);
  bVar6 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b0,&local_130);
  if (bVar6) {
    lVar10 = 0;
    lVar11 = 0;
    while( true ) {
      if ((pIVar12->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused <= lVar11) break;
      lVar15 = (long)*(int *)((long)(&((pIVar12->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar10);
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar9 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,*pdVar9,(type *)0x0);
      tVar7 = boost::multiprecision::operator<
                        (pnVar5 + lVar15,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&ptr);
      if (tVar7) {
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_8b8,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)(((pIVar12->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem)->val).m_backend.data._M_elems + lVar10));
        pnVar5 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = 0x1c;
        pnVar18 = pnVar5 + lVar15;
        psVar23 = local_530;
        for (lVar13 = lVar14; lVar13 != 0; lVar13 = lVar13 + -1) {
          *(undefined4 *)psVar23 = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
          psVar23 = psVar23 + (ulong)bVar27 * -8 + 4;
        }
        local_4c0 = pnVar5[lVar15].m_backend.exp;
        local_4bc = pnVar5[lVar15].m_backend.neg;
        local_4b8._0_4_ = pnVar5[lVar15].m_backend.fpclass;
        local_4b8._4_4_ = pnVar5[lVar15].m_backend.prec_elem;
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)&ptr;
        pnVar17 = &local_5b0;
        for (; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        local_5b0.m_backend.exp = 0;
        local_5b0.m_backend.neg = false;
        local_5b0.m_backend.fpclass = cpp_dec_float_finite;
        local_5b0.m_backend.prec_elem = 0x1c;
        maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result.m_backend,local_530,&local_5b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)0x0);
        rhs.m_backend.data._M_elems[0] = 0;
        rhs.m_backend.data._M_elems[1] = 0x3ff00000;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result.m_backend,(double *)&rhs);
        if (tVar7) {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&result.m_backend,1.0);
        }
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems[0x18] = 0;
        result_2.m_backend.data._M_elems[0x19] = 0;
        result_2.m_backend.data._M_elems._104_5_ = 0;
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_2.m_backend,
                   &(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend,&result.m_backend);
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 0x1c;
        result_3.m_backend.data._M_elems[0] = 0;
        result_3.m_backend.data._M_elems[1] = 0;
        result_3.m_backend.data._M_elems[2] = 0;
        result_3.m_backend.data._M_elems[3] = 0;
        result_3.m_backend.data._M_elems[4] = 0;
        result_3.m_backend.data._M_elems[5] = 0;
        result_3.m_backend.data._M_elems[6] = 0;
        result_3.m_backend.data._M_elems[7] = 0;
        result_3.m_backend.data._M_elems[8] = 0;
        result_3.m_backend.data._M_elems[9] = 0;
        result_3.m_backend.data._M_elems[10] = 0;
        result_3.m_backend.data._M_elems[0xb] = 0;
        result_3.m_backend.data._M_elems[0xc] = 0;
        result_3.m_backend.data._M_elems[0xd] = 0;
        result_3.m_backend.data._M_elems[0xe] = 0;
        result_3.m_backend.data._M_elems[0xf] = 0;
        result_3.m_backend.data._M_elems[0x10] = 0;
        result_3.m_backend.data._M_elems[0x11] = 0;
        result_3.m_backend.data._M_elems[0x12] = 0;
        result_3.m_backend.data._M_elems[0x13] = 0;
        result_3.m_backend.data._M_elems[0x14] = 0;
        result_3.m_backend.data._M_elems[0x15] = 0;
        result_3.m_backend.data._M_elems[0x16] = 0;
        result_3.m_backend.data._M_elems[0x17] = 0;
        result_3.m_backend.data._M_elems[0x18] = 0;
        result_3.m_backend.data._M_elems[0x19] = 0;
        result_3.m_backend.data._M_elems._104_5_ = 0;
        result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_3.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr,&result.m_backend);
        rhs.m_backend.fpclass = cpp_dec_float_finite;
        rhs.m_backend.prec_elem = 0x1c;
        rhs.m_backend.data._M_elems[0] = 0;
        rhs.m_backend.data._M_elems[1] = 0;
        rhs.m_backend.data._M_elems[2] = 0;
        rhs.m_backend.data._M_elems[3] = 0;
        rhs.m_backend.data._M_elems[4] = 0;
        rhs.m_backend.data._M_elems[5] = 0;
        rhs.m_backend.data._M_elems[6] = 0;
        rhs.m_backend.data._M_elems[7] = 0;
        rhs.m_backend.data._M_elems[8] = 0;
        rhs.m_backend.data._M_elems[9] = 0;
        rhs.m_backend.data._M_elems[10] = 0;
        rhs.m_backend.data._M_elems[0xb] = 0;
        rhs.m_backend.data._M_elems[0xc] = 0;
        rhs.m_backend.data._M_elems[0xd] = 0;
        rhs.m_backend.data._M_elems[0xe] = 0;
        rhs.m_backend.data._M_elems[0xf] = 0;
        rhs.m_backend.data._M_elems[0x10] = 0;
        rhs.m_backend.data._M_elems[0x11] = 0;
        rhs.m_backend.data._M_elems[0x12] = 0;
        rhs.m_backend.data._M_elems[0x13] = 0;
        rhs.m_backend.data._M_elems[0x14] = 0;
        rhs.m_backend.data._M_elems[0x15] = 0;
        rhs.m_backend.data._M_elems[0x16] = 0;
        rhs.m_backend.data._M_elems[0x17] = 0;
        rhs.m_backend.data._M_elems[0x18] = 0;
        rhs.m_backend.data._M_elems[0x19] = 0;
        rhs.m_backend.data._M_elems._104_5_ = 0;
        rhs.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        rhs.m_backend.exp = 0;
        rhs.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&rhs.m_backend,&result_2.m_backend,&result_3.m_backend);
        pcVar19 = &rhs.m_backend;
        pnVar17 = &local_630;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        local_630.m_backend.exp = rhs.m_backend.exp;
        local_630.m_backend.neg = rhs.m_backend.neg;
        local_630.m_backend.fpclass = rhs.m_backend.fpclass;
        local_630.m_backend.prec_elem = rhs.m_backend.prec_elem;
        epsZero(&local_1b0,this);
        bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_630,&local_1b0);
        if (bVar6) {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&rhs.m_backend,0.0);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&rhs.m_backend,&result.m_backend);
        }
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(lp,lVar15,&rhs.m_backend,0);
      }
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar9 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,-*pdVar9,(type *)0x0);
      tVar7 = boost::multiprecision::operator>
                        (pnVar5 + lVar15,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&ptr);
      if (tVar7) {
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_8b8,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)(((pIVar12->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem)->val).m_backend.data._M_elems + lVar10));
        pnVar5 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = 0x1c;
        pnVar18 = pnVar5 + lVar15;
        psVar23 = local_6b0;
        for (lVar13 = lVar14; lVar13 != 0; lVar13 = lVar13 + -1) {
          *(undefined4 *)psVar23 = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
          psVar23 = psVar23 + (ulong)bVar27 * -8 + 4;
        }
        local_640 = pnVar5[lVar15].m_backend.exp;
        local_63c = pnVar5[lVar15].m_backend.neg;
        local_638._0_4_ = pnVar5[lVar15].m_backend.fpclass;
        local_638._4_4_ = pnVar5[lVar15].m_backend.prec_elem;
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)&ptr;
        pnVar17 = &local_730;
        for (; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        local_730.m_backend.exp = 0;
        local_730.m_backend.neg = false;
        local_730.m_backend.fpclass = cpp_dec_float_finite;
        local_730.m_backend.prec_elem = 0x1c;
        maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result.m_backend,local_6b0,&local_730,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)0x0);
        rhs.m_backend.data._M_elems[0] = 0;
        rhs.m_backend.data._M_elems[1] = 0x3ff00000;
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result.m_backend,(double *)&rhs);
        if (tVar7) {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&result.m_backend,1.0);
        }
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems[0x18] = 0;
        result_2.m_backend.data._M_elems[0x19] = 0;
        result_2.m_backend.data._M_elems._104_5_ = 0;
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_2.m_backend,
                   &(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend,&result.m_backend);
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 0x1c;
        result_3.m_backend.data._M_elems[0] = 0;
        result_3.m_backend.data._M_elems[1] = 0;
        result_3.m_backend.data._M_elems[2] = 0;
        result_3.m_backend.data._M_elems[3] = 0;
        result_3.m_backend.data._M_elems[4] = 0;
        result_3.m_backend.data._M_elems[5] = 0;
        result_3.m_backend.data._M_elems[6] = 0;
        result_3.m_backend.data._M_elems[7] = 0;
        result_3.m_backend.data._M_elems[8] = 0;
        result_3.m_backend.data._M_elems[9] = 0;
        result_3.m_backend.data._M_elems[10] = 0;
        result_3.m_backend.data._M_elems[0xb] = 0;
        result_3.m_backend.data._M_elems[0xc] = 0;
        result_3.m_backend.data._M_elems[0xd] = 0;
        result_3.m_backend.data._M_elems[0xe] = 0;
        result_3.m_backend.data._M_elems[0xf] = 0;
        result_3.m_backend.data._M_elems[0x10] = 0;
        result_3.m_backend.data._M_elems[0x11] = 0;
        result_3.m_backend.data._M_elems[0x12] = 0;
        result_3.m_backend.data._M_elems[0x13] = 0;
        result_3.m_backend.data._M_elems[0x14] = 0;
        result_3.m_backend.data._M_elems[0x15] = 0;
        result_3.m_backend.data._M_elems[0x16] = 0;
        result_3.m_backend.data._M_elems[0x17] = 0;
        result_3.m_backend.data._M_elems[0x18] = 0;
        result_3.m_backend.data._M_elems[0x19] = 0;
        result_3.m_backend.data._M_elems._104_5_ = 0;
        result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_3.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr,&result.m_backend);
        rhs.m_backend.fpclass = cpp_dec_float_finite;
        rhs.m_backend.prec_elem = 0x1c;
        rhs.m_backend.data._M_elems[0] = 0;
        rhs.m_backend.data._M_elems[1] = 0;
        rhs.m_backend.data._M_elems[2] = 0;
        rhs.m_backend.data._M_elems[3] = 0;
        rhs.m_backend.data._M_elems[4] = 0;
        rhs.m_backend.data._M_elems[5] = 0;
        rhs.m_backend.data._M_elems[6] = 0;
        rhs.m_backend.data._M_elems[7] = 0;
        rhs.m_backend.data._M_elems[8] = 0;
        rhs.m_backend.data._M_elems[9] = 0;
        rhs.m_backend.data._M_elems[10] = 0;
        rhs.m_backend.data._M_elems[0xb] = 0;
        rhs.m_backend.data._M_elems[0xc] = 0;
        rhs.m_backend.data._M_elems[0xd] = 0;
        rhs.m_backend.data._M_elems[0xe] = 0;
        rhs.m_backend.data._M_elems[0xf] = 0;
        rhs.m_backend.data._M_elems[0x10] = 0;
        rhs.m_backend.data._M_elems[0x11] = 0;
        rhs.m_backend.data._M_elems[0x12] = 0;
        rhs.m_backend.data._M_elems[0x13] = 0;
        rhs.m_backend.data._M_elems[0x14] = 0;
        rhs.m_backend.data._M_elems[0x15] = 0;
        rhs.m_backend.data._M_elems[0x16] = 0;
        rhs.m_backend.data._M_elems[0x17] = 0;
        rhs.m_backend.data._M_elems[0x18] = 0;
        rhs.m_backend.data._M_elems[0x19] = 0;
        rhs.m_backend.data._M_elems._104_5_ = 0;
        rhs.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        rhs.m_backend.exp = 0;
        rhs.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&rhs.m_backend,&result_2.m_backend,&result_3.m_backend);
        pcVar19 = &rhs.m_backend;
        pnVar17 = &local_7b0;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        local_7b0.m_backend.exp = rhs.m_backend.exp;
        local_7b0.m_backend.neg = rhs.m_backend.neg;
        local_7b0.m_backend.fpclass = rhs.m_backend.fpclass;
        local_7b0.m_backend.prec_elem = rhs.m_backend.prec_elem;
        epsZero(&local_230,this);
        bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_7b0,&local_230);
        if (bVar6) {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&rhs.m_backend,0.0);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&rhs.m_backend,&result.m_backend);
        }
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])(lp,lVar15,&rhs.m_backend,0);
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x84;
    }
  }
  this_00 = (FixVariablePS *)operator_new(600);
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar18 = pnVar5 + j;
  pnVar17 = &local_2b0;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pnVar17->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
  }
  local_2b0.m_backend.exp = pnVar5[j].m_backend.exp;
  local_2b0.m_backend.neg = pnVar5[j].m_backend.neg;
  local_2b0.m_backend.fpclass = pnVar5[j].m_backend.fpclass;
  local_2b0.m_backend.prec_elem = pnVar5[j].m_backend.prec_elem;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_9c8,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
  ;
  FixVariablePS::FixVariablePS
            (this_00,lp,this,j,&local_2b0,(shared_ptr<soplex::Tolerances> *)&local_9c8,correctIdx);
  std::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixVariablePS,void>
            ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              *)&ptr,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_9c8._M_refcount);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void SPxMainSM<R>::fixColumn(SPxLPBase<R>& lp, int j, bool correctIdx)
{

   assert(EQrel(lp.lower(j), lp.upper(j), feastol()));

   R lo            = lp.lower(j);
   R up            = lp.upper(j);
   const SVectorBase<R>& col = lp.colVector(j);
   R mid           = lo;

   // use the center value between slightly different bounds to improve numerics
   if(NE(lo, up, this->tolerances()->epsilon()))
      mid = (up + lo) / 2.0;

   assert(lo < R(infinity) && lo > R(-infinity));
   assert(up < R(infinity) && up > R(-infinity));

   SPxOut::debug(this, "IMAISM66 fix variable x{}: lower={} upper={} to new value: {}\n", j, lo, up,
                 mid);

   if(isNotZero(lo, this->epsZero()))
   {
      for(int k = 0; k < col.size(); ++k)
      {
         int i = col.index(k);

         if(lp.rhs(i) < R(infinity))
         {
            R y     = mid * col.value(k);
            R scale = maxAbs(lp.rhs(i), y);

            if(scale < 1.0)
               scale = 1.0;

            R rhs = (lp.rhs(i) / scale) - (y / scale);

            if(isZero(rhs, this->epsZero()))
               rhs = 0.0;
            else
               rhs *= scale;

            SPxOut::debug(this, "IMAISM67 row {}: rhs={} ({}) aij={}\n", i, rhs, lp.rhs(i), col.value(k));

            lp.changeRhs(i, rhs);
         }

         if(lp.lhs(i) > R(-infinity))
         {
            R y     = mid * col.value(k);
            R scale = maxAbs(lp.lhs(i), y);

            if(scale < 1.0)
               scale = 1.0;

            R lhs = (lp.lhs(i) / scale) - (y / scale);

            if(isZero(lhs, this->epsZero()))
               lhs = 0.0;
            else
               lhs *= scale;

            SPxOut::debug(this, "IMAISM68 row {}: lhs={} ({}) aij={}\n", i, lhs, lp.lhs(i), col.value(k));

            lp.changeLhs(i, lhs);
         }

         assert(lp.lhs(i) <= lp.rhs(i) + feastol());
      }
   }

   std::shared_ptr<PostStep> ptr(new FixVariablePS(lp, *this, j, lp.lower(j), this->_tolerances,
                                 correctIdx));
   m_hist.append(ptr);
}